

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapping0.c
# Opt level: O1

vorbis_info_mapping * mapping0_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  uint uVar2;
  uint *__s;
  long lVar3;
  ulong uVar4;
  long lVar5;
  vorbis_info_mapping0 *info;
  char cVar6;
  int bits;
  uint bits_00;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  
  __s = (uint *)calloc(1,0xc90);
  pvVar1 = vi->codec_setup;
  memset(__s,0,0xc90);
  uVar8 = 1;
  lVar3 = oggpack_read(opb,1);
  if (lVar3 != 0) {
    lVar3 = oggpack_read(opb,4);
    uVar8 = (int)lVar3 + 1;
  }
  *__s = uVar8;
  lVar3 = oggpack_read(opb,1);
  if (lVar3 != 0) {
    lVar3 = oggpack_read(opb,8);
    __s[0x123] = (uint)lVar3 + 1;
    if ((uint)lVar3 < 0x7fffffff) {
      lVar3 = 0;
      do {
        uVar2 = vi->channels;
        bits = 0;
        if (1 < uVar2) {
          bits = 0;
          uVar4 = (ulong)(uVar2 - 1);
          if (uVar2 == 0) {
            uVar4 = 0;
          }
          do {
            bits = bits + 1;
            uVar2 = (uint)uVar4;
            uVar4 = uVar4 >> 1;
          } while (1 < uVar2);
        }
        lVar5 = oggpack_read(opb,bits);
        uVar9 = (uint)lVar5;
        __s[lVar3 + 0x124] = uVar9;
        uVar2 = vi->channels;
        bits_00 = 0;
        if (1 < uVar2) {
          uVar7 = 0;
          uVar4 = (ulong)(uVar2 - 1);
          if (uVar2 == 0) {
            uVar4 = uVar7;
          }
          do {
            bits_00 = (int)uVar7 + 1;
            uVar7 = (ulong)bits_00;
            uVar2 = (uint)uVar4;
            uVar4 = uVar4 >> 1;
          } while (1 < uVar2);
        }
        lVar5 = oggpack_read(opb,bits_00);
        uVar2 = (uint)lVar5;
        __s[lVar3 + 0x224] = uVar2;
        cVar6 = '\x05';
        if (((-1 < (int)uVar9) && (-1 < (int)uVar2)) && (uVar9 != uVar2)) {
          cVar6 = (vi->channels <= (int)uVar2 || vi->channels <= (int)uVar9) * '\x05';
        }
        if (cVar6 != '\0') {
          if (cVar6 != '\x05') {
            return __s;
          }
          goto LAB_00122189;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < (int)__s[0x123]);
    }
  }
  lVar3 = oggpack_read(opb,2);
  if (lVar3 < 1) {
    if ((1 < (int)uVar8) && (0 < vi->channels)) {
      lVar3 = 0;
      do {
        lVar5 = oggpack_read(opb,4);
        __s[lVar3 + 1] = (uint)lVar5;
        if ((int)uVar8 <= (int)(uint)lVar5) goto LAB_00122189;
        lVar3 = lVar3 + 1;
      } while (lVar3 < vi->channels);
    }
    if (0 < (int)uVar8) {
      uVar4 = 0;
      do {
        lVar3 = oggpack_read(opb,8);
        cVar6 = '\x05';
        if ((int)lVar3 < *(int *)((long)pvVar1 + 0x18)) {
          lVar3 = oggpack_read(opb,8);
          __s[uVar4 + 0x101] = (uint)lVar3;
          if ((int)(uint)lVar3 < *(int *)((long)pvVar1 + 0x1c)) {
            lVar3 = oggpack_read(opb,8);
            __s[uVar4 + 0x111] = (uint)lVar3;
            cVar6 = (*(int *)((long)pvVar1 + 0x20) <= (int)(uint)lVar3) * '\x05';
          }
        }
        if (cVar6 != '\0') {
          if (cVar6 != '\x05') {
            return __s;
          }
          goto LAB_00122189;
        }
        uVar4 = uVar4 + 1;
      } while (uVar8 != uVar4);
    }
  }
  else {
LAB_00122189:
    memset(__s,0,0xc90);
    free(__s);
    __s = (uint *)0x0;
  }
  return __s;
}

Assistant:

static vorbis_info_mapping *mapping0_unpack(vorbis_info *vi,oggpack_buffer *opb){
  int i;
  vorbis_info_mapping0 *info=(vorbis_info_mapping0 *)_ogg_calloc(1,sizeof(*info));
  codec_setup_info     *ci=(codec_setup_info *)vi->codec_setup;
  memset(info,0,sizeof(*info));

  if(oggpack_read(opb,1))
    info->submaps=oggpack_read(opb,4)+1;
  else
    info->submaps=1;

  if(oggpack_read(opb,1)){
    info->coupling_steps=oggpack_read(opb,8)+1;

    for(i=0;i<info->coupling_steps;i++){
      int testM=info->coupling_mag[i]=oggpack_read(opb,ilog(vi->channels));
      int testA=info->coupling_ang[i]=oggpack_read(opb,ilog(vi->channels));

      if(testM<0 || 
	 testA<0 || 
	 testM==testA || 
	 testM>=vi->channels ||
	 testA>=vi->channels) goto err_out;
    }

  }

  if(oggpack_read(opb,2)>0)goto err_out; /* 2,3:reserved */
    
  if(info->submaps>1){
    for(i=0;i<vi->channels;i++){
      info->chmuxlist[i]=oggpack_read(opb,4);
      if(info->chmuxlist[i]>=info->submaps)goto err_out;
    }
  }
  for(i=0;i<info->submaps;i++){
    int temp=oggpack_read(opb,8);
    if(temp>=ci->times)goto err_out;
    info->floorsubmap[i]=oggpack_read(opb,8);
    if(info->floorsubmap[i]>=ci->floors)goto err_out;
    info->residuesubmap[i]=oggpack_read(opb,8);
    if(info->residuesubmap[i]>=ci->residues)goto err_out;
  }

  return info;

 err_out:
  mapping0_free_info(info);
  return(NULL);
}